

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZArc3D>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZArc3D> *this,void **vtt)

{
  void *pvVar1;
  long lVar2;
  
  pvVar1 = vtt[1];
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(&(this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine> + -2) +
            *(long *)((long)pvVar1 + -0x60)) = vtt[2];
  (this->super_TPZGeoEl).fMesh = (TPZGeoMesh *)0x0;
  (this->super_TPZGeoEl).fId = -1;
  (this->super_TPZGeoEl).fMatId = 0;
  (this->super_TPZGeoEl).fReference = (TPZCompEl *)0x0;
  *(undefined4 *)&(this->super_TPZGeoEl).fFatherIndex = 0xffffffff;
  *(undefined4 *)((long)&(this->super_TPZGeoEl).fFatherIndex + 4) = 0xffffffff;
  *(undefined4 *)&(this->super_TPZGeoEl).fIndex = 0xffffffff;
  *(undefined4 *)((long)&(this->super_TPZGeoEl).fIndex + 4) = 0xffffffff;
  (this->super_TPZGeoEl).fNumInterfaces = 0;
  pvVar1 = *vtt;
  *(void **)&this->super_TPZGeoEl = pvVar1;
  *(void **)((long)(&(this->fGeo).super_TPZNodeRep<3,_pztopology::TPZLine> + -2) +
            *(long *)((long)pvVar1 + -0x60)) = vtt[3];
  pzgeom::TPZArc3D::TPZArc3D(&this->fGeo);
  lVar2 = 0;
  do {
    *(undefined ***)((long)&this->fNeighbours[0].super_TPZSavable._vptr_TPZSavable + lVar2) =
         &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)((long)&this->fNeighbours[0].fSide + lVar2) = 0xffffffff;
    *(undefined8 *)((long)&this->fNeighbours[0].fGeoElIndex + lVar2) = 0xffffffffffffffff;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x48);
  this->fNeighbours[0].fGeoElIndex = -1;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[1].fGeoElIndex = -1;
  this->fNeighbours[1].fSide = -1;
  this->fNeighbours[2].fGeoElIndex = -1;
  this->fNeighbours[2].fSide = -1;
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess():TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),
TPZGeoEl(){
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
}